

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O3

void dump_bf(Bframe *bf)

{
  printf("\n*** Basic Frame");
  printf("\nInvalid basic frame");
  return;
}

Assistant:

void dump_bf(Bframe *bf) {
  DLword *ptr;
  printf("\n*** Basic Frame");
  if (BFRAMEPTR(bf)->flags != 4) {
    printf("\nInvalid basic frame");
    return;
  }

  if (BFRAMEPTR(bf)->residual) { goto printflags; }

  ptr = NativeAligned2FromStackOffset(bf->ivar);
  if ((((DLword *)bf - ptr) > 512) || (((UNSIGNED)ptr & 1) != 0)) {
    printf("\nInvalid basic frame");
    return;
  }
  while (ptr < (DLword *)bf) {
    printf("\n %x : %x %x", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));
    print(*ptr);
    ptr += 2;
  }

printflags:
  printf("\n %x : %x %x ", LAddrFromNative(bf), *(DLword *)bf, *((DLword *)bf + 1));
  putchar('[');
  if (BFRAMEPTR(bf)->residual) printf("Residual, ");
  if (BFRAMEPTR(bf)->padding) printf("Padded, ");
  printf("usecnt=%d ] ", BFRAMEPTR(bf)->usecnt);
  printf("ivar : 0x%x", BFRAMEPTR(bf)->ivar);
}